

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_token_delete(yaml_token_t *token)

{
  yaml_token_t *token_local;
  
  if (token != (yaml_token_t *)0x0) {
    switch(token->type) {
    case YAML_TAG_DIRECTIVE_TOKEN:
      yaml_free((token->data).tag.handle);
      yaml_free((token->data).tag.suffix);
      break;
    default:
      break;
    case YAML_ALIAS_TOKEN:
      yaml_free((token->data).tag.handle);
      break;
    case YAML_ANCHOR_TOKEN:
      yaml_free((token->data).tag.handle);
      break;
    case YAML_TAG_TOKEN:
      yaml_free((token->data).tag.handle);
      yaml_free((token->data).tag.suffix);
      break;
    case YAML_SCALAR_TOKEN:
      yaml_free((token->data).tag.handle);
    }
    memset(token,0,0x50);
    return;
  }
  __assert_fail("token",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x24a,"void yaml_token_delete(yaml_token_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_token_delete(yaml_token_t *token)
{
    assert(token);  /* Non-NULL token object expected. */

    switch (token->type)
    {
        case YAML_TAG_DIRECTIVE_TOKEN:
            yaml_free(token->data.tag_directive.handle);
            yaml_free(token->data.tag_directive.prefix);
            break;

        case YAML_ALIAS_TOKEN:
            yaml_free(token->data.alias.value);
            break;

        case YAML_ANCHOR_TOKEN:
            yaml_free(token->data.anchor.value);
            break;

        case YAML_TAG_TOKEN:
            yaml_free(token->data.tag.handle);
            yaml_free(token->data.tag.suffix);
            break;

        case YAML_SCALAR_TOKEN:
            yaml_free(token->data.scalar.value);
            break;

        default:
            break;
    }

    memset(token, 0, sizeof(yaml_token_t));
}